

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::Array<capnp::_::RawBrandedSchema::Scope>::~Array(Array<capnp::_::RawBrandedSchema::Scope> *this)

{
  Array<capnp::_::RawBrandedSchema::Scope> *this_local;
  
  dispose(this);
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }